

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.h
# Opt level: O2

void __thiscall
USBControlTransferParser::SetHIDUsagePage(USBControlTransferParser *this,U16 usagePage)

{
  ulong in_RAX;
  pointer puVar1;
  undefined8 uStack_18;
  
  puVar1 = (this->mHidUsagePageStack).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mHidUsagePageStack).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_start == puVar1) {
    uStack_18 = in_RAX & 0xffffffffffff;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&this->mHidUsagePageStack,(unsigned_short *)((long)&uStack_18 + 6));
    puVar1 = (this->mHidUsagePageStack).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  puVar1[-1] = usagePage;
  return;
}

Assistant:

void SetHIDUsagePage( U16 usagePage )
    {
        if( mHidUsagePageStack.empty() )
            mHidUsagePageStack.push_back( 0 );

        mHidUsagePageStack.back() = usagePage;
    }